

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.h
# Opt level: O0

void __thiscall jaegertracing::thrift::Process::Process(Process *this)

{
  Process *this_local;
  
  apache::thrift::TBase::TBase((TBase *)this);
  *(code **)this = jaegertracing::net::http::get;
  *(code **)this = jaegertracing::net::http::get;
  std::__cxx11::string::string((string *)(this + 8));
  std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>::vector
            ((vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_> *)
             (this + 0x28));
  _Process__isset::_Process__isset((_Process__isset *)(this + 0x40));
  return;
}

Assistant:

Process() : serviceName() {
  }